

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O1

int UnityGetAudioEffectDefinitions(UnityAudioEffectDefinition ***definitionptr)

{
  int iVar1;
  long lVar2;
  UnityAudioEffectDefinition *pUVar3;
  long lVar4;
  
  if (UnityGetAudioEffectDefinitions::numeffects == 0) {
    UnityGetAudioEffectDefinitions::numeffects = 1;
    memset(UnityGetAudioEffectDefinitions::definition,0,0x88);
    builtin_strncpy((char *)&UnityGetAudioEffectDefinitions::definition[0].structsize,
                    "Demo Equalizer",0xf);
    UnityGetAudioEffectDefinitions::definition[0].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[0].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[0].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[0].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[0].create = Equalizer::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[0].release = Equalizer::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[0].process = Equalizer::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[0].setfloatparameter =
         Equalizer::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[0].getfloatparameter =
         Equalizer::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[0].getfloatbuffer = Equalizer::GetFloatBufferCallback
    ;
    Equalizer::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 0xd,"nerator",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Imp",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 8,"actGener",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = ImpactGenerator::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = ImpactGenerator::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = ImpactGenerator::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         ImpactGenerator::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         ImpactGenerator::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         ImpactGenerator::GetFloatBufferCallback;
    ImpactGenerator::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 0xe,"nerator",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Imp",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 8,"ulseGene",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = ImpulseGenerator::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = ImpulseGenerator::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = ImpulseGenerator::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         ImpulseGenerator::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         ImpulseGenerator::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         ImpulseGenerator::GetFloatBufferCallback;
    ImpulseGenerator::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Lev",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 8,"elMixer",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = LevelMixer::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = LevelMixer::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = LevelMixer::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         LevelMixer::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         LevelMixer::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         LevelMixer::GetFloatBufferCallback;
    LevelMixer::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar2)
    ;
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Lof",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 7,"finator",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = Lofinator::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = Lofinator::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = Lofinator::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         Lofinator::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         Lofinator::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         Lofinator::GetFloatBufferCallback;
    Lofinator::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    UnityGetAudioEffectDefinitions::definition[lVar2].name[0x10] = '\0';
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Mod",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 8,"alFilter",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = ModalFilter::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = ModalFilter::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = ModalFilter::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         ModalFilter::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         ModalFilter::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         ModalFilter::GetFloatBufferCallback;
    ModalFilter::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Mul",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 7,"ltiband",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = Multiband::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = Multiband::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = Multiband::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         Multiband::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         Multiband::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         Multiband::GetFloatBufferCallback;
    Multiband::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Noi",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 6,"oiseBox",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = NoiseBox::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = NoiseBox::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = NoiseBox::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         NoiseBox::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         NoiseBox::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         NoiseBox::GetFloatBufferCallback;
    NoiseBox::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 0xf,"tor",4);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Pit",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 8,"chDetect",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = PitchDetector::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = PitchDetector::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = PitchDetector::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         PitchDetector::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         PitchDetector::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         PitchDetector::GetFloatBufferCallback;
    PitchDetector::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 0xf,"tor",4);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Rin",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 8,"gModulat",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = RingModulator::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = RingModulator::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = RingModulator::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         RingModulator::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         RingModulator::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         RingModulator::GetFloatBufferCallback;
    RingModulator::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Ste",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 8,"reoWiden",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 0xf,"ner",4);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = StereoWidener::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = StereoWidener::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = StereoWidener::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         StereoWidener::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         StereoWidener::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         StereoWidener::GetFloatBufferCallback;
    StereoWidener::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Tee",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 7,"eBee3o3",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = TeeBee::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = TeeBee::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = TeeBee::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         TeeBee::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         TeeBee::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         TeeBee::GetFloatBufferCallback;
    TeeBee::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Tee",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 7,"eDee9o9",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = TeeDee::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = TeeDee::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = TeeDee::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         TeeDee::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         TeeDee::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         TeeDee::GetFloatBufferCallback;
    TeeDee::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 0xf,"tor",4);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Tub",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 8,"eResonat",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = TubeResonator::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = TubeResonator::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = TubeResonator::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         TubeResonator::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         TubeResonator::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         TubeResonator::GetFloatBufferCallback;
    TubeResonator::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Voc",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 5,"Vocoder",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = Vocoder::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = Vocoder::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = Vocoder::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         Vocoder::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         Vocoder::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         Vocoder::GetFloatBufferCallback;
    Vocoder::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Wah",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 8,"Wah",4);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = WahWah::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = WahWah::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = WahWah::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         WahWah::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         WahWah::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         WahWah::GetFloatBufferCallback;
    WahWah::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 0xf,"nReverb",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Con",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 8,"volution",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = ConvolutionReverb::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = ConvolutionReverb::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = ConvolutionReverb::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         ConvolutionReverb::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         ConvolutionReverb::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         ConvolutionReverb::GetFloatBufferCallback;
    ConvolutionReverb::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 0xe,"onMeter",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Cor",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 8,"relation",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = CorrelationMeter::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = CorrelationMeter::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = CorrelationMeter::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         CorrelationMeter::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         CorrelationMeter::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         CorrelationMeter::GetFloatBufferCallback;
    CorrelationMeter::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Gra",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 8,"nulator",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = Granulator::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = Granulator::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = Granulator::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         Granulator::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         Granulator::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         Granulator::GetFloatBufferCallback;
    Granulator::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar2)
    ;
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Lou",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 8,"dnessMet",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 0xf,"ter",4);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = LoudnessMeter::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = LoudnessMeter::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = LoudnessMeter::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         LoudnessMeter::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         LoudnessMeter::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         LoudnessMeter::GetFloatBufferCallback;
    LoudnessMeter::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Osc",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 8,"illoscop",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].name[0x10] = 'e';
    UnityGetAudioEffectDefinitions::definition[lVar2].name[0x11] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = Oscilloscope::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = Oscilloscope::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = Oscilloscope::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         Oscilloscope::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         Oscilloscope::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         Oscilloscope::GetFloatBufferCallback;
    Oscilloscope::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Rou",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 5,"Routing",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = Routing::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = Routing::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = Routing::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         Routing::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         Routing::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         Routing::GetFloatBufferCallback;
    Routing::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    UnityGetAudioEffectDefinitions::definition[lVar2].name[0x10] = '\0';
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Spa",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 8,"tializer",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = Spatializer::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = Spatializer::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = Spatializer::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         Spatializer::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         Spatializer::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         Spatializer::GetFloatBufferCallback;
    Spatializer::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 0x10," Reverb",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Spa",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 8,"tializer",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = SpatializerReverb::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = SpatializerReverb::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = SpatializerReverb::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         SpatializerReverb::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         SpatializerReverb::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         SpatializerReverb::GetFloatBufferCallback;
    SpatializerReverb::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar2);
    lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    memset(UnityGetAudioEffectDefinitions::definition + lVar2,0,0x88);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name,"Demo Tel",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar2].name + 6,"eleport",8);
    UnityGetAudioEffectDefinitions::definition[lVar2].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar2].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar2].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar2].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar2].create = Teleport::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].release = Teleport::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].process = Teleport::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].setfloatparameter =
         Teleport::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatparameter =
         Teleport::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar2].getfloatbuffer =
         Teleport::GetFloatBufferCallback;
    Teleport::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar2);
  }
  iVar1 = UnityGetAudioEffectDefinitions::numeffects;
  lVar2 = (long)UnityGetAudioEffectDefinitions::numeffects;
  if (0 < lVar2) {
    pUVar3 = UnityGetAudioEffectDefinitions::definition;
    lVar4 = 0;
    do {
      *(UnityAudioEffectDefinition **)((long)UnityGetAudioEffectDefinitions::definitionp + lVar4) =
           pUVar3;
      lVar4 = lVar4 + 8;
      pUVar3 = pUVar3 + 1;
    } while (lVar2 * 8 - lVar4 != 0);
  }
  *definitionptr = UnityGetAudioEffectDefinitions::definitionp;
  return iVar1;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API int AUDIO_CALLING_CONVENTION UnityGetAudioEffectDefinitions(UnityAudioEffectDefinition*** definitionptr)
{
    static UnityAudioEffectDefinition definition[256];
    static UnityAudioEffectDefinition* definitionp[256];
    static int numeffects = 0;
    if (numeffects == 0)
    {
        #include "PluginList.h"
    }
    for (int n = 0; n < numeffects; n++)
        definitionp[n] = &definition[n];
    *definitionptr = definitionp;
    return numeffects;
}